

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_yangversion(lysp_yang_ctx *ctx,lysp_module *mod)

{
  char cVar1;
  uint8_t uVar2;
  LY_ERR LVar3;
  char *format;
  ly_ctx *plVar4;
  char *pcVar5;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  ly_stmt local_4c;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  if (mod->version == '\0') {
    LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_48,&local_38,&local_40);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (local_40 == 3) {
      if ((*local_48 == '1') && (local_48[1] == '.')) {
        uVar2 = '\x02';
        cVar1 = local_48[2];
joined_r0x0017b5d1:
        if (cVar1 == '1') {
          mod->version = uVar2;
          free(local_38);
          LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          if (local_4c == LY_STMT_SYNTAX_SEMICOLON) {
            return LY_SUCCESS;
          }
          if (local_4c == LY_STMT_SYNTAX_LEFT_BRACE) {
            LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            if (local_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
              return LY_SUCCESS;
            }
            do {
              if (local_4c != LY_STMT_EXTENSION_INSTANCE) {
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar4 = (ly_ctx *)0x0;
                }
                else {
                  plVar4 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar5 = lyplg_ext_stmt2str(local_4c);
                ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,"yang-version");
                return LY_EVALID;
              }
              LVar3 = parse_ext(ctx,local_48,local_40,mod,LY_STMT_YANG_VERSION,0,&mod->exts);
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
              LVar3 = get_keyword(ctx,&local_4c,&local_48,&local_40);
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
            } while (local_4c != LY_STMT_SYNTAX_RIGHT_BRACE);
            return LY_SUCCESS;
          }
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar4 = (ly_ctx *)0x0;
          }
          else {
            plVar4 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar5 = lyplg_ext_stmt2str(local_4c);
          format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
          goto LAB_0017b591;
        }
      }
    }
    else if (local_40 == 1) {
      uVar2 = '\x01';
      cVar1 = *local_48;
      goto joined_r0x0017b5d1;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar4 = (ly_ctx *)0x0;
    }
    else {
      plVar4 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",local_40,
            local_48,"yang-version");
    free(local_38);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar4 = (ly_ctx *)0x0;
    }
    else {
      plVar4 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar5 = "yang-version";
LAB_0017b591:
    ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_yangversion(struct lysp_yang_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (mod->version) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "yang-version");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == 1) && !strncmp(word, "1", word_len)) {
        mod->version = LYS_VERSION_1_0;
    } else if ((word_len == ly_strlen_const("1.1")) && !strncmp(word, "1.1", word_len)) {
        mod->version = LYS_VERSION_1_1;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "yang-version");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, mod, LY_STMT_YANG_VERSION, 0, &mod->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "yang-version");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}